

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::TableScanDeserialize(Deserializer *deserializer,TableFunction *function)

{
  undefined8 uVar1;
  int iVar2;
  ClientContext *context;
  pointer pTVar3;
  SerializationException *this;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> catalog;
  undefined1 local_f0 [32];
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  string local_90;
  Val local_70;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[2])(function,100,"catalog");
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[0x1a])(&local_90,function);
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[3])(function);
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[2])(function,0x65,"schema");
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[0x1a])(&local_b0,function);
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[3])(function);
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[2])(function,0x66,"table");
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[0x1a])(&local_d0,function);
  (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
    _vptr_Function[3])(function);
  context = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)function);
  local_f0._0_8_ =
       Catalog::GetEntry<duckdb::TableCatalogEntry>
                 (context,&local_90,(string *)&local_b0,&local_d0,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_f0);
  uVar1 = local_f0._0_8_;
  if (*(CatalogType *)(local_f0._0_8_ + 0x10) == TABLE_ENTRY) {
    local_f0._0_8_ = operator_new(0x30);
    (((TableCatalogEntry *)local_f0._0_8_)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.oid = 0;
    *(undefined8 *)
     &(((TableCatalogEntry *)local_f0._0_8_)->super_StandardEntry).super_InCatalogEntry.
      super_CatalogEntry.type = 0;
    (((TableCatalogEntry *)local_f0._0_8_)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.set.ptr = (CatalogSet *)0x0;
    (((TableCatalogEntry *)local_f0._0_8_)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry._vptr_CatalogEntry = (_func_int **)&PTR__TableFunctionData_019843e8;
    (((TableCatalogEntry *)local_f0._0_8_)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.name._M_dataplus._M_p = (pointer)uVar1;
    *(undefined2 *)
     &(((TableCatalogEntry *)local_f0._0_8_)->super_StandardEntry).super_InCatalogEntry.
      super_CatalogEntry.name._M_string_length = 0;
    pTVar3 = unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
             ::operator->((unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
                           *)local_f0);
    (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
      _vptr_Function[2])(function,0x67,"is_index_scan");
    iVar2 = (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
              _vptr_Function[0xc])(function);
    pTVar3->is_index_scan = SUB41(iVar2,0);
    (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
      _vptr_Function[3])(function);
    pTVar3 = unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
             ::operator->((unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
                           *)local_f0);
    (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
      _vptr_Function[2])(function,0x68,"is_create_index");
    iVar2 = (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
              _vptr_Function[0xc])(function);
    pTVar3->is_create_index = SUB41(iVar2,0);
    (*(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
      _vptr_Function[3])(function);
    Deserializer::ReadDeletedProperty<duckdb::vector<long,false>>
              ((Deserializer *)function,0x69,"result_ids");
    deserializer->_vptr_Deserializer = (_func_int **)local_f0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((char *)local_b0._M_allocated_capacity != local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           deserializer;
  }
  this = (SerializationException *)__cxa_allocate_exception(0x10);
  local_f0._0_8_ = local_f0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Cant find table for %s.%s","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_b0._M_allocated_capacity,
             (char *)(local_b0._8_8_ + local_b0._M_allocated_capacity));
  local_70.bigint = (int64_t)local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  SerializationException::SerializationException<std::__cxx11::string,std::__cxx11::string>
            (this,(string *)local_f0,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70.hugeint)
  ;
  __cxa_throw(this,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> TableScanDeserialize(Deserializer &deserializer, TableFunction &function) {
	auto catalog = deserializer.ReadProperty<string>(100, "catalog");
	auto schema = deserializer.ReadProperty<string>(101, "schema");
	auto table = deserializer.ReadProperty<string>(102, "table");
	auto &catalog_entry =
	    Catalog::GetEntry<TableCatalogEntry>(deserializer.Get<ClientContext &>(), catalog, schema, table);
	if (catalog_entry.type != CatalogType::TABLE_ENTRY) {
		throw SerializationException("Cant find table for %s.%s", schema, table);
	}
	auto result = make_uniq<TableScanBindData>(catalog_entry.Cast<DuckTableEntry>());
	deserializer.ReadProperty(103, "is_index_scan", result->is_index_scan);
	deserializer.ReadProperty(104, "is_create_index", result->is_create_index);
	deserializer.ReadDeletedProperty<unsafe_vector<row_t>>(105, "result_ids");
	return std::move(result);
}